

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O0

void __thiscall Js::PropertyRecord::Dump(PropertyRecord *this,uint indent)

{
  uint uVar1;
  uint32 uVar2;
  char16 *pcVar3;
  uint fieldIndent;
  char16_t *padding;
  uint indent_local;
  PropertyRecord *this_local;
  
  uVar1 = indent + 2;
  Output::Print(L"%*sPropertyRecord (0x%p):\n",(ulong)indent,L"");
  Output::Print(L"%*spid: %d\n",(ulong)uVar1,L"",(ulong)(uint)this->pid);
  Output::Print(L"%*shash: 0x%08x\n",(ulong)uVar1,L"",(ulong)this->hash);
  Output::Print(L"%*sisNumeric: %d\n",(ulong)uVar1,L"",(ulong)(this->isNumeric & 1));
  Output::Print(L"%*sIsBound: %d\n",(ulong)uVar1,L"",(ulong)(this->isBound & 1));
  Output::Print(L"%*sIsSymbol: %d\n",(ulong)uVar1,L"",(ulong)(this->isSymbol & 1));
  Output::Print(L"%*sbyteCount: %u\n",(ulong)uVar1,L"",(ulong)this->byteCount);
  if ((this->isNumeric & 1U) == 0) {
    pcVar3 = GetBuffer(this);
    Output::Print(L"%*sbuffer (string): %s\n",(ulong)uVar1,L"",pcVar3);
  }
  else {
    uVar2 = GetNumericValue(this);
    Output::Print(L"%*sbuffer (numeric): %u\n",(ulong)uVar1,L"",(ulong)uVar2);
  }
  return;
}

Assistant:

void PropertyRecord::Dump(unsigned indent) const
    {
        const auto padding(_u(""));
        const unsigned fieldIndent(indent + 2);

        Output::Print(_u("%*sPropertyRecord (0x%p):\n"), indent, padding, this);
        Output::Print(_u("%*spid: %d\n"), fieldIndent, padding, this->pid);
        Output::Print(_u("%*shash: 0x%08x\n"), fieldIndent, padding, this->hash);
        Output::Print(_u("%*sisNumeric: %d\n"), fieldIndent, padding, this->isNumeric);
        Output::Print(_u("%*sIsBound: %d\n"), fieldIndent, padding, this->isBound);
        Output::Print(_u("%*sIsSymbol: %d\n"), fieldIndent, padding, this->isSymbol);
        Output::Print(_u("%*sbyteCount: %u\n"), fieldIndent, padding, this->byteCount);
        if (this->isNumeric)
        {
            Output::Print(_u("%*sbuffer (numeric): %u\n"), fieldIndent, padding, this->GetNumericValue());
        }
        else
        {
            Output::Print(_u("%*sbuffer (string): %s\n"), fieldIndent, padding, this->GetBuffer());
        }
    }